

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O2

void pospopcnt_u8_sse_popcnt4bit(uint8_t *data,size_t len,uint32_t *flag_counts)

{
  ulong uVar1;
  uint8_t *data_00;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined8 uVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [64];
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [32];
  undefined1 auVar42 [64];
  undefined1 auVar43 [32];
  undefined1 auVar44 [64];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [64];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  
  auVar45._8_8_ = 0x5555555555555555;
  auVar45._0_8_ = 0x5555555555555555;
  auVar46._8_8_ = 0xaaaaaaaaaaaaaaaa;
  auVar46._0_8_ = 0xaaaaaaaaaaaaaaaa;
  auVar47._8_8_ = 0x3333333333333333;
  auVar47._0_8_ = 0x3333333333333333;
  auVar49._8_8_ = 0xcccccccccccccccc;
  auVar49._0_8_ = 0xcccccccccccccccc;
  auVar50[8] = 0xf;
  auVar50._0_8_ = 0xf0f0f0f0f0f0f0f;
  auVar50[9] = 0xf;
  auVar50[10] = 0xf;
  auVar50[0xb] = 0xf;
  auVar50[0xc] = 0xf;
  auVar50[0xd] = 0xf;
  auVar50[0xe] = 0xf;
  auVar50[0xf] = 0xf;
  auVar3 = vmovdqa64_avx512vl(_DAT_0011e170);
  uVar1 = len & 0xffffffffffffffc0;
  auVar23 = ZEXT1664((undefined1  [16])0x0);
  auVar42 = ZEXT1664((undefined1  [16])0x0);
  auVar44 = ZEXT1664((undefined1  [16])0x0);
  auVar48 = ZEXT1664((undefined1  [16])0x0);
  auVar4 = vpxord_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
  auVar5 = vpxord_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
  auVar6 = vpxord_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
  auVar7 = vpxord_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
  auVar8 = vpxord_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
  auVar26 = ZEXT1664((undefined1  [16])0x0);
  auVar28 = ZEXT1664((undefined1  [16])0x0);
  auVar30 = ZEXT1664((undefined1  [16])0x0);
  auVar34 = ZEXT1664((undefined1  [16])0x0);
  auVar38 = ZEXT1664((undefined1  [16])0x0);
  auVar39 = ZEXT1664((undefined1  [16])0x0);
  auVar40 = ZEXT1664((undefined1  [16])0x0);
  iVar2 = 0;
  data_00 = data + uVar1;
  while( true ) {
    auVar33 = auVar23._0_32_;
    auVar19 = auVar40._0_16_;
    auVar20 = auVar39._0_16_;
    auVar35 = auVar38._0_16_;
    auVar31 = auVar34._0_16_;
    auVar29 = auVar30._0_16_;
    auVar27 = auVar28._0_16_;
    auVar24 = auVar26._0_16_;
    if (uVar1 == 0) break;
    auVar9 = vmovdqu64_avx512vl(*(undefined1 (*) [16])((long)data + 0x10));
    auVar10 = vmovdqu64_avx512vl(*(undefined1 (*) [16])data);
    auVar11 = vmovdqu64_avx512vl(*(undefined1 (*) [16])((long)data + 0x30));
    auVar12 = vmovdqu64_avx512vl(*(undefined1 (*) [16])((long)data + 0x20));
    iVar2 = iVar2 + 1;
    auVar13 = vpaddb_avx512vl(auVar9,auVar9);
    auVar9 = vpsrld_avx512vl(auVar9,1);
    auVar13 = vpternlogq_avx512vl(auVar13,auVar46,auVar10,0xe2);
    auVar9 = vpternlogq_avx512vl(auVar9,auVar45,auVar10,0xe2);
    auVar10 = vpaddb_avx512vl(auVar11,auVar11);
    auVar11 = vpsrld_avx512vl(auVar11,1);
    auVar11 = vpternlogq_avx512vl(auVar11,auVar45,auVar12,0xe2);
    auVar10 = vpternlogq_avx512vl(auVar10,auVar46,auVar12,0xe2);
    auVar12 = vpslld_avx512vl(auVar10,2);
    auVar14 = vpslld_avx512vl(auVar11,2);
    auVar10 = vpsrld_avx512vl(auVar10,2);
    auVar11 = vpsrld_avx512vl(auVar11,2);
    auVar10 = vpternlogq_avx512vl(auVar10,auVar47,auVar13,0xe2);
    auVar11 = vpternlogq_avx512vl(auVar11,auVar47,auVar9,0xe2);
    auVar12 = vpternlogq_avx512vl(auVar12,auVar49,auVar13,0xe2);
    auVar9 = vpternlogq_avx512vl(auVar14,auVar49,auVar9,0xe2);
    auVar13 = vpandq_avx512vl(auVar12,auVar50);
    auVar14 = vpandq_avx512vl(auVar9,auVar50);
    auVar15 = vpandq_avx512vl(auVar10,auVar50);
    auVar16 = vpandq_avx512vl(auVar11,auVar50);
    auVar12 = vpsrld_avx512vl(auVar12,4);
    auVar9 = vpsrld_avx512vl(auVar9,4);
    auVar10 = vpsrld_avx512vl(auVar10,4);
    auVar11 = vpsrld_avx512vl(auVar11,4);
    auVar12 = vpandq_avx512vl(auVar12,auVar50);
    auVar9 = vpandq_avx512vl(auVar9,auVar50);
    auVar10 = vpandq_avx512vl(auVar10,auVar50);
    auVar11 = vpandq_avx512vl(auVar11,auVar50);
    auVar13 = vpshufb_avx512vl(auVar3,auVar13);
    auVar14 = vpshufb_avx512vl(auVar3,auVar14);
    auVar15 = vpshufb_avx512vl(auVar3,auVar15);
    auVar16 = vpshufb_avx512vl(auVar3,auVar16);
    auVar12 = vpshufb_avx512vl(auVar3,auVar12);
    auVar9 = vpshufb_avx512vl(auVar3,auVar9);
    auVar17 = vpshufb_avx512vl(auVar3,auVar10);
    auVar18 = vpshufb_avx512vl(auVar3,auVar11);
    auVar8 = vpaddb_avx512vl(auVar13,auVar8);
    auVar7 = vpaddb_avx512vl(auVar14,auVar7);
    auVar6 = vpaddb_avx512vl(auVar15,auVar6);
    auVar5 = vpaddb_avx512vl(auVar16,auVar5);
    auVar4 = vpaddb_avx512vl(auVar12,auVar4);
    auVar11 = vpaddb_avx512vl(auVar9,auVar48._0_16_);
    auVar10 = vpaddb_avx512vl(auVar17,auVar44._0_16_);
    auVar9 = vpaddb_avx512vl(auVar18,auVar42._0_16_);
    if (iVar2 == 0x3f) {
      auVar13 = vpxord_avx512vl(auVar17,auVar17);
      iVar2 = 0;
      auVar8 = vpsadbw_avx512vl(auVar8,auVar13);
      auVar7 = vpsadbw_avx512vl(auVar7,auVar13);
      auVar12 = vpsadbw_avx512vl(auVar6,auVar13);
      auVar5 = vpsadbw_avx512vl(auVar5,auVar13);
      auVar4 = vpsadbw_avx512vl(auVar4,auVar13);
      auVar6 = vpsadbw_avx512vl(auVar11,auVar13);
      auVar10 = vpsadbw_avx512vl(auVar10,auVar13);
      auVar9 = vpsadbw_avx512vl(auVar9,auVar13);
      auVar19 = vpaddq_avx512vl(auVar8,auVar19);
      auVar40 = ZEXT1664(auVar19);
      auVar20 = vpaddq_avx512vl(auVar7,auVar20);
      auVar39 = ZEXT1664(auVar20);
      auVar20 = vpaddq_avx512vl(auVar12,auVar35);
      auVar38 = ZEXT1664(auVar20);
      auVar20 = vpaddq_avx512vl(auVar5,auVar31);
      auVar34 = ZEXT1664(auVar20);
      auVar20 = vpaddq_avx512vl(auVar4,auVar29);
      auVar30 = ZEXT1664(auVar20);
      auVar6 = vpaddq_avx(auVar6,auVar27);
      auVar28 = ZEXT1664(auVar6);
      auVar6 = vpaddq_avx(auVar10,auVar24);
      auVar26 = ZEXT1664(auVar6);
      auVar6 = vpaddq_avx(auVar9,auVar23._0_16_);
      auVar23 = ZEXT1664(auVar6);
      auVar9 = (undefined1  [16])0x0;
      auVar10 = (undefined1  [16])0x0;
      auVar11 = (undefined1  [16])0x0;
      auVar4 = vpxord_avx512vl(auVar4,auVar4);
      auVar5 = vpxord_avx512vl(auVar5,auVar5);
      auVar6 = vpxord_avx512vl(auVar12,auVar12);
      auVar7 = vpxord_avx512vl(auVar7,auVar7);
      auVar8 = vpxord_avx512vl(auVar8,auVar8);
    }
    auVar48 = ZEXT1664(auVar11);
    auVar44 = ZEXT1664(auVar10);
    auVar42 = ZEXT1664(auVar9);
    data = (uint8_t *)((long)data + 0x40);
    uVar1 = uVar1 - 0x40;
  }
  if (iVar2 != 0) {
    auVar7 = vpsadbw_avx512vl(auVar7,(undefined1  [16])0x0);
    auVar45 = vpsadbw_avx512vl(auVar6,(undefined1  [16])0x0);
    auVar8 = vpsadbw_avx512vl(auVar8,(undefined1  [16])0x0);
    auVar3 = vpsadbw_avx(auVar44._0_16_,(undefined1  [16])0x0);
    auVar6 = vpsadbw_avx(auVar42._0_16_,(undefined1  [16])0x0);
    auVar20 = vpaddq_avx(auVar7,auVar20);
    auVar7 = vpsadbw_avx512vl(auVar5,(undefined1  [16])0x0);
    auVar35 = vpaddq_avx(auVar45,auVar35);
    auVar5 = vpsadbw_avx512vl(auVar4,(undefined1  [16])0x0);
    auVar19 = vpaddq_avx(auVar8,auVar19);
    auVar24 = vpaddq_avx(auVar3,auVar24);
    auVar3 = vpaddq_avx(auVar6,auVar23._0_16_);
    auVar33 = ZEXT1632(auVar3);
    auVar31 = vpaddq_avx(auVar7,auVar31);
    auVar3 = vpsadbw_avx(auVar48._0_16_,(undefined1  [16])0x0);
    auVar29 = vpaddq_avx(auVar5,auVar29);
    auVar27 = vpaddq_avx(auVar3,auVar27);
  }
  auVar3 = vpunpcklqdq_avx(auVar19,auVar20);
  auVar6 = vpunpckhqdq_avx(auVar19,auVar20);
  uVar21 = auVar31._0_8_;
  auVar43._8_8_ = uVar21;
  auVar43._0_8_ = uVar21;
  auVar43._16_8_ = uVar21;
  auVar43._24_8_ = uVar21;
  auVar7 = auVar33._0_16_;
  auVar32._0_16_ = ZEXT116(0) * auVar31 + ZEXT116(1) * auVar7;
  auVar32._16_16_ = ZEXT116(0) * auVar33._16_16_ + ZEXT116(1) * auVar31;
  auVar41._0_16_ = ZEXT116(0) * auVar35 + ZEXT116(1) * auVar3;
  auVar41._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar35;
  auVar3 = vpshufd_avx(auVar35,0xee);
  auVar36._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar6;
  auVar36._16_16_ = ZEXT116(1) * auVar3;
  auVar25 = vpblendd_avx2(auVar41,auVar43,0xc0);
  auVar32 = vpblendd_avx2(auVar36,auVar32,0xc0);
  uVar21 = auVar33._0_8_;
  auVar37._8_8_ = uVar21;
  auVar37._0_8_ = uVar21;
  auVar37._16_8_ = uVar21;
  auVar37._24_8_ = uVar21;
  auVar22._0_16_ = ZEXT116(0) * auVar7 + ZEXT116(1) * auVar7;
  auVar22._16_16_ = ZEXT116(0) * auVar33._16_16_ + ZEXT116(1) * auVar7;
  auVar33 = vpaddq_avx2(auVar25,auVar32);
  auVar3 = vpmovqd_avx512vl(auVar33);
  auVar3 = vpaddd_avx(auVar3,*(undefined1 (*) [16])flag_counts);
  *(undefined1 (*) [16])flag_counts = auVar3;
  auVar3 = vpunpcklqdq_avx(auVar29,auVar27);
  auVar6 = vpunpckhqdq_avx(auVar29,auVar27);
  auVar33._0_16_ = ZEXT116(0) * auVar24 + ZEXT116(1) * auVar3;
  auVar33._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar24;
  auVar3 = vpshufd_avx(auVar24,0xee);
  auVar25._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar6;
  auVar25._16_16_ = ZEXT116(1) * auVar3;
  auVar33 = vpblendd_avx2(auVar33,auVar37,0xc0);
  auVar25 = vpblendd_avx2(auVar25,auVar22,0xc0);
  auVar33 = vpaddq_avx2(auVar33,auVar25);
  auVar3 = vpmovqd_avx512vl(auVar33);
  auVar3 = vpaddd_avx(auVar3,*(undefined1 (*) [16])(flag_counts + 4));
  *(undefined1 (*) [16])(flag_counts + 4) = auVar3;
  pospopcnt_u8_scalar_naive(data_00,(ulong)((uint)len & 0x3f),flag_counts);
  return;
}

Assistant:

void pospopcnt_u8_sse_popcnt4bit(const uint8_t* data, size_t len, uint32_t* flag_counts) {
    const __m128i zero = _mm_setzero_si128();

    __m128i counter_a = zero;
    __m128i counter_b = zero;
    __m128i counter_c = zero;
    __m128i counter_d = zero;
    __m128i counter_e = zero;
    __m128i counter_f = zero;
    __m128i counter_g = zero;
    __m128i counter_h = zero;

    const __m128i popcnt_4bit = _mm_setr_epi8(
        /* 0 */ 0, /* 1 */ 1, /* 2 */ 1, /* 3 */ 2,
        /* 4 */ 1, /* 5 */ 2, /* 6 */ 2, /* 7 */ 3,
        /* 8 */ 1, /* 9 */ 2, /* a */ 2, /* b */ 3,
        /* c */ 2, /* d */ 3, /* e */ 3, /* f */ 4
    );

    const __m128i lo_nibble = _mm_set1_epi8(0x0f);

    int local = 0;
    __m128i counter8bit_a = zero;
    __m128i counter8bit_b = zero;
    __m128i counter8bit_c = zero;
    __m128i counter8bit_d = zero;
    __m128i counter8bit_e = zero;
    __m128i counter8bit_f = zero;
    __m128i counter8bit_g = zero;
    __m128i counter8bit_h = zero;

    for (const uint8_t* end = &data[(len & ~63)]; data != end; data += 64) {
        // r0 = [a0|b0|c0|d0|e0|f0|g0|h0]
        // r1 = [a1|b1|c1|d1|e1|f1|g1|h1]
        // r2 = [a2|b2|c2|d2|e2|f2|g2|h2]
        // r3 = [a3|b3|c3|d3|e3|f3|g3|h3]
        const __m128i r0 = _mm_loadu_si128((__m128i*)&data[0*16]);
        const __m128i r1 = _mm_loadu_si128((__m128i*)&data[1*16]);
        const __m128i r2 = _mm_loadu_si128((__m128i*)&data[2*16]);
        const __m128i r3 = _mm_loadu_si128((__m128i*)&data[3*16]);

        // s0 = [a0|a1|c0|c1|e0|e1|g0|g1]
        // s1 = [b0|b1|d0|d1|f0|f1|h0|h1]
        // s2 = [a2|a3|c2|c3|e2|e3|g2|g3]
        // s3 = [b2|b3|d2|d3|f2|f3|h2|h3]
        const __m128i s0 = sse4_merge1_even(r0, r1);
        const __m128i s1 = sse4_merge1_odd (r0, r1);
        const __m128i s2 = sse4_merge1_even(r2, r3);
        const __m128i s3 = sse4_merge1_odd (r2, r3);

        // d0 = [a0|a1|a2|a3|e0|e1|e2|e3]
        // d1 = [b0|b1|b2|b3|f0|f1|f2|f3]
        // d2 = [c0|c1|c2|c3|g0|g1|g2|g3]
        // d3 = [d0|d1|d2|d3|h0|h1|h2|h3]
        const __m128i d0 = sse4_merge2_even(s0, s2);
        const __m128i d1 = sse4_merge2_even(s1, s3);
        const __m128i d2 = sse4_merge2_odd (s0, s2);
        const __m128i d3 = sse4_merge2_odd (s1, s3);

        // popcnt for 4-bit subwords in each registers
        const __m128i popcnt_a = _mm_shuffle_epi8(popcnt_4bit, d0 & lo_nibble);
        const __m128i popcnt_e = _mm_shuffle_epi8(popcnt_4bit, _mm_srli_epi32(d0, 4) & lo_nibble);
        const __m128i popcnt_b = _mm_shuffle_epi8(popcnt_4bit, d1 & lo_nibble);
        const __m128i popcnt_f = _mm_shuffle_epi8(popcnt_4bit, _mm_srli_epi32(d1, 4) & lo_nibble);
        const __m128i popcnt_c = _mm_shuffle_epi8(popcnt_4bit, d2 & lo_nibble);
        const __m128i popcnt_g = _mm_shuffle_epi8(popcnt_4bit, _mm_srli_epi32(d2, 4) & lo_nibble);
        const __m128i popcnt_d = _mm_shuffle_epi8(popcnt_4bit, d3 & lo_nibble);
        const __m128i popcnt_h = _mm_shuffle_epi8(popcnt_4bit, _mm_srli_epi32(d3, 4) & lo_nibble);

        counter8bit_a = _mm_add_epi8(counter8bit_a, popcnt_a);
        counter8bit_b = _mm_add_epi8(counter8bit_b, popcnt_b);
        counter8bit_c = _mm_add_epi8(counter8bit_c, popcnt_c);
        counter8bit_d = _mm_add_epi8(counter8bit_d, popcnt_d);
        counter8bit_e = _mm_add_epi8(counter8bit_e, popcnt_e);
        counter8bit_f = _mm_add_epi8(counter8bit_f, popcnt_f);
        counter8bit_g = _mm_add_epi8(counter8bit_g, popcnt_g);
        counter8bit_h = _mm_add_epi8(counter8bit_h, popcnt_h);

        local += 1;
        if (local == 63) {
            // avoid overflows in the 8-bit counters
#define U(n) \
            counter_##n = _mm_add_epi64(counter_##n, _mm_sad_epu8(counter8bit_##n, zero)); \
            counter8bit_##n = _mm_setzero_si128();

            U(a) U(b) U(c) U(d)
            U(e) U(f) U(g) U(h)
#undef U
            local = 0;
        }
    }

    if (local != 0) {
#define U(n) counter_##n = _mm_add_epi64(counter_##n, _mm_sad_epu8(counter8bit_##n, zero));
        U(a) U(b) U(c) U(d)
        U(e) U(f) U(g) U(h)
#undef U
    }

    flag_counts[0] += sse4_sum_epu64(counter_a);
    flag_counts[1] += sse4_sum_epu64(counter_b);
    flag_counts[2] += sse4_sum_epu64(counter_c);
    flag_counts[3] += sse4_sum_epu64(counter_d);
    flag_counts[4] += sse4_sum_epu64(counter_e);
    flag_counts[5] += sse4_sum_epu64(counter_f);
    flag_counts[6] += sse4_sum_epu64(counter_g);
    flag_counts[7] += sse4_sum_epu64(counter_h);

    // scalar tail loop
    pospopcnt_u8_scalar_naive(data, len % 64, flag_counts);
}